

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONState.cxx
# Opt level: O0

string * __thiscall
cmJSONState::GetJsonContext_abi_cxx11_
          (string *__return_storage_ptr__,cmJSONState *this,Location loc)

{
  _Ios_Openmode _Var1;
  char local_202;
  allocator<char> local_201;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  char local_1d9;
  int local_1d8;
  int i;
  undefined1 local_1c8 [8];
  stringstream sstream;
  undefined1 local_40 [8];
  string line;
  cmJSONState *this_local;
  Location loc_local;
  
  line.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_40);
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1c8,(string *)&this->doc,_Var1);
  for (local_1d8 = 0; this_local._0_4_ = loc.line, local_1d8 < (int)this_local;
      local_1d8 = local_1d8 + 1) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_1c8,(string *)local_40,'\n');
  }
  local_1d9 = '\n';
  this_local._4_4_ = loc.column;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,(long)(this_local._4_4_ + -1),' ',&local_201);
  local_202 = '^';
  cmStrCat<std::__cxx11::string&,char,std::__cxx11::string,char>
            (__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             &local_1d9,&local_200,&local_202);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmJSONState::GetJsonContext(Location loc)
{
  std::string line;
  std::stringstream sstream(doc);
  for (int i = 0; i < loc.line; ++i) {
    std::getline(sstream, line, '\n');
  }
  return cmStrCat(line, '\n', std::string(loc.column - 1, ' '), '^');
}